

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Module *this_00;
  Var start;
  undefined1 local_90 [112];
  
  GetLocation((Location *)(local_90 + 8),this);
  Var::Var((Var *)(local_90 + 0x28),func_index,(Location *)(local_90 + 8));
  this_00 = this->module_;
  GetLocation((Location *)(local_90 + 8),this);
  std::make_unique<wabt::StartModuleField,wabt::Var&,wabt::Location>
            ((Var *)local_90,(Location *)(local_90 + 0x28));
  Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                               *)local_90);
  if ((long *)local_90._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_90._0_8_ + 8))();
  }
  local_90._0_8_ = 0;
  Var::~Var((Var *)(local_90 + 0x28));
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(
      std::make_unique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}